

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall Heap<4U>::Insert(Heap<4U> *this,Data<4U> *item,count_type counter)

{
  bool bVar1;
  uint32_t *puVar2;
  mapped_type *pmVar3;
  int in_EDX;
  Data<4U> *in_RSI;
  Heap<4U> *in_RDI;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t uVar4;
  undefined8 in_stack_ffffffffffffffc8;
  Counter *pCVar5;
  uint32_t i;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_28;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_20;
  int local_14;
  Data<4U> *local_10;
  
  i = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x118f7a);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    pCVar5 = in_RDI->heaps;
    pmVar3 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (key_type *)in_stack_ffffffffffffffb8);
    pCVar5[*pmVar3].counter = pCVar5[*pmVar3].counter + 1;
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (key_type *)in_stack_ffffffffffffffb8);
    Heap_Down(in_RDI,(uint32_t)((ulong)pCVar5 >> 0x20));
  }
  else if (in_RDI->heap_num < in_RDI->SIZE) {
    Data<4U>::operator=(&in_RDI->heaps[in_RDI->heap_num].item,local_10);
    in_RDI->heaps[in_RDI->heap_num].counter = local_14;
    uVar4 = in_RDI->heap_num;
    in_RDI->heap_num = uVar4 + 1;
    puVar2 = (uint32_t *)
             std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                          (key_type *)in_stack_ffffffffffffffb8);
    *puVar2 = uVar4;
    Heap_Up(in_RDI,i);
  }
  else if (in_RDI->heaps->counter < local_14) {
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::erase((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (key_type *)in_stack_ffffffffffffffb8);
    Data<4U>::operator=(&in_RDI->heaps->item,local_10);
    in_RDI->heaps->counter = local_14;
    pmVar3 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (key_type *)in_stack_ffffffffffffffb8);
    *pmVar3 = 0;
    Heap_Down(in_RDI,i);
  }
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, count_type counter) {
		if (mp.find(item) != mp.end()) {
			heaps[mp[item]].counter++;
			Heap_Down(mp[item]);
		}
		else if (heap_num < SIZE) {
			heaps[heap_num].item = item;
			heaps[heap_num].counter = counter;
			mp[item] = heap_num++;
			Heap_Up(heap_num - 1);
		}
		else if (counter > heaps[0].counter) {
			mp.erase(heaps[0].item);
			heaps[0].item = item;
			heaps[0].counter = counter;
			mp[item] = 0;
			Heap_Down(0);
		}
	}